

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>::push_back
          (SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true> *this,
          CompUnitEntry *Elt)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
      super_SmallVectorBase.Capacity <= uVar3) {
    grow(this,0);
    uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
            super_SmallVectorBase.Size;
  }
  uVar2 = Elt->Length;
  puVar1 = (uint64_t *)
           ((long)(this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
                  super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x10);
  *puVar1 = Elt->Offset;
  puVar1[1] = uVar2;
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>
                    ).super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }